

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter01.c
# Opt level: O1

int main(void)

{
  ZyanStatus ZVar1;
  int iVar2;
  ZyanU64 ZVar3;
  ulong uVar4;
  ZyanU8 *buffer;
  ZyanUSize length;
  ZydisDecoder decoder;
  ZyanU8 data [27];
  ZydisDecodedInstruction instruction;
  char local_6a8 [264];
  ZydisFormatter formatter;
  ZydisDecodedOperand operands [10];
  
  ZVar3 = ZydisGetVersion();
  if (ZVar3 == 0x4000000000000) {
    buffer = data;
    data[0x10] = '\x0f';
    data[0x11] = 0x84;
    data[0x12] = '\0';
    data[0x13] = '\0';
    data[0x14] = '\0';
    data[0x15] = '\0';
    data[0x16] = 0xe9;
    data[0x17] = 0xe5;
    data[0x18] = '\x0f';
    data[0x19] = '\0';
    data[0x1a] = '\0';
    data[0] = 'H';
    data[1] = 0x8b;
    data[2] = '\x05';
    data[3] = '9';
    data[4] = '\0';
    data[5] = '\x13';
    data[6] = '\0';
    data[7] = 'P';
    data[8] = 0xff;
    data[9] = '\x15';
    data[10] = 0xf2;
    data[0xb] = '\x10';
    data[0xc] = '\0';
    data[0xd] = '\0';
    data[0xe] = 0x85;
    data[0xf] = 0xc0;
    ZydisDecoderInit(&decoder,ZYDIS_MACHINE_MODE_LONG_64,ZYDIS_STACK_WIDTH_64);
    ZydisFormatterInit(&formatter,ZYDIS_FORMATTER_STYLE_INTEL);
    ZydisFormatterSetProperty(&formatter,ZYDIS_FORMATTER_PROP_FORCE_SEGMENT,1);
    ZydisFormatterSetProperty(&formatter,ZYDIS_FORMATTER_PROP_FORCE_SIZE,1);
    default_print_address_absolute = ZydisFormatterPrintAddressAbsolute;
    ZydisFormatterSetHook
              (&formatter,ZYDIS_FORMATTER_FUNC_PRINT_ADDRESS_ABS,&default_print_address_absolute);
    length = 0x1b;
    ZVar1 = ZydisDecoderDecodeFull(&decoder,buffer,0x1b,&instruction,operands);
    if (-1 < (int)ZVar1) {
      ZVar3 = 0x7fffffff400000;
      do {
        printf("%016lX  ",ZVar3);
        ZydisFormatterFormatInstruction
                  (&formatter,&instruction,operands,instruction.operand_count_visible,local_6a8,
                   0x100,ZVar3,(void *)0x0);
        printf(" %s\n",local_6a8);
        uVar4 = (ulong)instruction.length;
        buffer = buffer + uVar4;
        length = length - uVar4;
        ZVar3 = ZVar3 + uVar4;
        ZVar1 = ZydisDecoderDecodeFull(&decoder,buffer,length,&instruction,operands);
      } while (-1 < (int)ZVar1);
    }
    iVar2 = 0;
  }
  else {
    main_cold_1();
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int main(void)
{
    if (ZydisGetVersion() != ZYDIS_VERSION)
    {
        fputs("Invalid zydis version\n", ZYAN_STDERR);
        return EXIT_FAILURE;
    }

    ZyanU8 data[] =
    {
        0x48, 0x8B, 0x05, 0x39, 0x00, 0x13, 0x00, // mov rax, qword ptr ds:[<SomeModule.SomeData>]
        0x50,                                     // push rax
        0xFF, 0x15, 0xF2, 0x10, 0x00, 0x00,       // call qword ptr ds:[<SomeModule.SomeFunction>]
        0x85, 0xC0,                               // test eax, eax
        0x0F, 0x84, 0x00, 0x00, 0x00, 0x00,       // jz 0x007FFFFFFF400016
        0xE9, 0xE5, 0x0F, 0x00, 0x00              // jmp <SomeModule.EntryPoint>
    };

    ZydisDecoder decoder;
    ZydisDecoderInit(&decoder, ZYDIS_MACHINE_MODE_LONG_64, ZYDIS_STACK_WIDTH_64);

    DisassembleBuffer(&decoder, &data[0], sizeof(data));

    return 0;
}